

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
          (TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *this,
          TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *o)

{
  this->NumUsed = 0;
  M_Free(this->Nodes);
  this->Size = 0;
  this->NumUsed = 0;
  this->Nodes = (Node *)0x0;
  this->LastFree = (Node *)0x0;
  this->Nodes = o->Nodes;
  this->LastFree = o->LastFree;
  this->Size = o->Size;
  this->NumUsed = o->NumUsed;
  o->Size = 0;
  o->NumUsed = 0;
  o->Nodes = (Node *)0x0;
  o->LastFree = (Node *)0x0;
  SetNodeVector(o,1);
  return;
}

Assistant:

void TransferFrom(TMap &o)
	{
		// Clear all our nodes.
		NumUsed = 0;
		ClearNodeVector();

		// Copy all of o's nodes.
		Nodes = o.Nodes;
		LastFree = o.LastFree;
		Size = o.Size;
		NumUsed = o.NumUsed;

		// Tell o it doesn't have any nodes.
		o.Nodes = NULL;
		o.Size = 0;
		o.LastFree = NULL;
		o.NumUsed = 0;

		// Leave o functional with one empty node.
		o.SetNodeVector(1);
	}